

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_rawequal(lua_State *L)

{
  int iVar1;
  TValue *o1_00;
  TValue *o2_00;
  long in_RDI;
  cTValue *o2;
  cTValue *o1;
  undefined8 in_stack_ffffffffffffffe8;
  lua_State *in_stack_fffffffffffffff0;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  o1_00 = lj_lib_checkany(in_stack_fffffffffffffff0,iVar1);
  o2_00 = lj_lib_checkany((lua_State *)&o1_00->field_2,iVar1);
  iVar1 = lj_obj_equal(o1_00,o2_00);
  *(int *)(*(long *)(in_RDI + 0x18) + -4) = -2 - iVar1;
  return 1;
}

Assistant:

LJLIB_CF(rawequal)		LJLIB_REC(.)
{
  cTValue *o1 = lj_lib_checkany(L, 1);
  cTValue *o2 = lj_lib_checkany(L, 2);
  setboolV(L->top-1, lj_obj_equal(o1, o2));
  return 1;
}